

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
* __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
::operator=(unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
            *this,initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
                  il)

{
  bool bVar1;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *hash_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *in_RDI;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *pos;
  locator loc;
  size_t pos0;
  size_t hash;
  raw_key_type *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos_1;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *in_stack_fffffffffffffe50;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *in_stack_fffffffffffffe58;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *__y;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *__x;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *this_01;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  local_170 [2];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *in_stack_fffffffffffffeb0;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  local_a0;
  size_t local_88;
  size_t local_80;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *local_78;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  *local_70;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *local_10;
  
  clear((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
         *)0x36b875);
  hash_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
             *)std::
               initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
               ::begin(local_170);
  this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
             *)std::
               initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
               ::end((initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
                      *)in_stack_fffffffffffffe50);
  this_01 = in_RDI;
  do {
    if (hash_00 == this_00) {
      return (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
              *)this_01;
    }
    __y = in_RDI;
    local_70 = hash_00;
    local_78 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
                *)detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
                              *)0x36b92b);
    local_80 = detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_88 = detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
               ::position_for(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    local_10 = local_78;
    local_20 = local_80;
    __x = __y;
    local_18 = local_88;
    detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                           *)0x36b9e5);
      local_40 = local_40 + local_38;
      local_44 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
      if (local_44 != 0) {
        local_50 = detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                               *)0x36ba30);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffe50 =
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                *)detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                          *)0x36ba80);
          in_stack_fffffffffffffe58 = local_10;
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
                      *)0x36baad);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this_01,(basic_string_view<char,_std::char_traits<char>_> *)__x,
                             (basic_string_view<char,_std::char_traits<char>_> *)__y);
          if (bVar1) {
            detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0036bba1;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                        ((group15<boost::unordered::detail::foa::plain_integral> *)
                         in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      if (bVar1) {
        memset(&local_a0,0,0x18);
        detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
        ::table_locator(&local_a0);
        goto LAB_0036bba1;
      }
      bVar1 = detail::foa::pow2_quadratic_prober::next
                        (&local_30,
                         (((table_type *)&__x->arrays)->
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                         ).arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_a0,0,0x18);
    detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
    ::table_locator(&local_a0);
LAB_0036bba1:
    bVar1 = detail::foa::table_locator::operator_cast_to_bool((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                 ::make_iterator((locator *)0x36bbc1);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  *)(local_170 + 1),&local_b0,&local_b1);
    }
    else if ((__y->size_ctrl).size < (__y->size_ctrl).ml) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
      ::
      unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>const&>
                (this_01,(size_t)__x,(size_t)__y,in_stack_fffffffffffffe58);
      local_c8 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                 ::make_iterator((locator *)0x36bc3e);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  *)(local_170 + 1),&local_c8,local_e1);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
      ::
      unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>const&>
                (this_00,(size_t)hash_00,in_stack_fffffffffffffeb0);
      local_f8 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                 ::make_iterator((locator *)0x36bca1);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  *)(local_170 + 1),&local_f8,local_111);
    }
    hash_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
               *)&hash_00->size_ctrl;
  } while( true );
}

Assistant:

unordered_flat_map& operator=(std::initializer_list<value_type> il) {
        this->clear();
        this->insert(il.begin(), il.end());
        return *this;
    }